

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::writeHighsOptions(Highs *this,string *filename,bool report_only_non_default_values)

{
  HighsStatus HVar1;
  byte in_DL;
  bool in_stack_0000012f;
  string *in_stack_00000130;
  Highs *in_stack_00000138;
  string *alt_method_name;
  string *in_stack_ffffffffffffff88;
  Highs *in_stack_ffffffffffffff90;
  undefined1 local_39 [40];
  byte local_11;
  
  local_11 = in_DL & 1;
  alt_method_name = (string *)local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_39 + 1),"writeHighsOptions",(allocator *)alt_method_name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff90,"writeOptions",(allocator *)&stack0xffffffffffffff8f
            );
  deprecationMessage(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,alt_method_name);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  HVar1 = writeOptions(in_stack_00000138,in_stack_00000130,in_stack_0000012f);
  return HVar1;
}

Assistant:

HighsStatus Highs::writeHighsOptions(
    const std::string& filename, const bool report_only_non_default_values) {
  deprecationMessage("writeHighsOptions", "writeOptions");
  return writeOptions(filename, report_only_non_default_values);
}